

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool ON_IsOrthogonalFrame(ON_2dVector *X,ON_2dVector *Y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = ABS(X->x);
  dVar3 = ABS(X->y);
  dVar5 = dVar3;
  if (dVar3 <= dVar2) {
    dVar5 = dVar2;
  }
  if (dVar5 <= 2.2250738585072014e-308) {
    if (dVar5 <= 0.0) {
      dVar5 = 0.0;
    }
  }
  else {
    if (dVar3 <= dVar2) {
      dVar2 = dVar3;
    }
    dVar2 = (dVar2 / dVar5) * (dVar2 / dVar5) + 1.0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar5 = dVar5 * dVar2;
  }
  dVar2 = ABS(Y->x);
  dVar4 = ABS(Y->y);
  dVar3 = dVar4;
  if (dVar4 <= dVar2) {
    dVar3 = dVar2;
  }
  if (dVar3 <= 2.2250738585072014e-308) {
    if (dVar3 <= 0.0) {
      dVar3 = 0.0;
    }
  }
  else {
    if (dVar4 <= dVar2) {
      dVar2 = dVar4;
    }
    dVar2 = (dVar2 / dVar3) * (dVar2 / dVar3) + 1.0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar3 = dVar3 * dVar2;
  }
  bVar1 = false;
  if ((1.490116119385e-08 < dVar5) && (bVar1 = false, 1.490116119385e-08 < dVar3)) {
    bVar1 = ABS((X->x * Y->x + X->y * Y->y) * (1.0 / dVar5) * (1.0 / dVar3)) <= 1.490116119385e-08;
  }
  return bVar1;
}

Assistant:

bool ON_IsOrthogonalFrame( const ON_2dVector& X,  const ON_2dVector& Y )
{
  // returns true if X, Y, Z is an orthogonal frame
  double lx = X.Length();
  double ly = Y.Length();
  if ( lx <=  ON_SQRT_EPSILON )
    return false;
  if ( ly <=  ON_SQRT_EPSILON )
    return false;
  lx = 1.0/lx;
  ly = 1.0/ly;
  double x = ON_DotProduct( X, Y )*lx*ly;
  if ( fabs(x) >  ON_SQRT_EPSILON )
    return false;
  return true;
}